

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::extMul<4ul,short,int,(wasm::LaneOrder)1>
          (Literal *__return_storage_ptr__,wasm *this,Literal *a,Literal *b)

{
  Type *other;
  int32_t iVar1;
  int32_t iVar2;
  Literal *val;
  long lVar3;
  Literal *this_00;
  Literal *this_01;
  bool bVar4;
  undefined1 local_238 [8];
  LaneArray<4UL_*_2> lhs;
  LaneArray<4UL_*_2> rhs;
  LaneArray<4UL> result;
  Literal *local_38;
  
  getLanes<short,8>((LaneArray<8> *)local_238,this,a);
  getLanes<short,8>((LaneArray<8> *)&lhs._M_elems[7].type,(wasm *)a,val);
  this_01 = (Literal *)&rhs._M_elems[7].type;
  result._M_elems[3].field_0.i64 = 0;
  result._M_elems[3].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[2].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[2].type.id = 0;
  result._M_elems[1].type.id = 0;
  result._M_elems[2].field_0.i64 = 0;
  result._M_elems[1].field_0.i64 = 0;
  result._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].type.id = 0;
  rhs._M_elems[7].type.id = 0;
  result._M_elems[0].field_0.i64 = 0;
  local_38 = (Literal *)&rhs._M_elems[3].type;
  lVar3 = 4;
  this_00 = (Literal *)&lhs._M_elems[3].type;
  other = &result._M_elems[3].type;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    iVar1 = Literal::geti32(this_00);
    iVar2 = Literal::geti32(local_38);
    result._M_elems[3].type.id._0_4_ = (int)(short)iVar2 * (int)(short)iVar1;
    if (this_01 != (Literal *)other) {
      Literal::~Literal(this_01);
      Literal::Literal(this_01,(Literal *)other);
    }
    Literal::~Literal((Literal *)other);
    this_01 = this_01 + 1;
    local_38 = local_38 + 1;
    this_00 = this_00 + 1;
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<4> *)&rhs._M_elems[7].type);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&rhs._M_elems[7].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&lhs._M_elems[7].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_238);
  return __return_storage_ptr__;
}

Assistant:

Literal extMul(const Literal& a, const Literal& b) {
  LaneArray<Lanes* 2> lhs = getLanes<LaneFrom, Lanes * 2>(a);
  LaneArray<Lanes* 2> rhs = getLanes<LaneFrom, Lanes * 2>(b);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lhs[idx].geti32() *
                        (LaneTo)(LaneFrom)rhs[idx].geti32());
  }
  return Literal(result);
}